

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void initMemArray(Mem *p,int N,sqlite3 *db,u16 flags)

{
  uint uVar1;
  int *piVar2;
  
  if (0 < N) {
    uVar1 = N + 1;
    piVar2 = &p->szMalloc;
    do {
      *(u16 *)(piVar2 + -3) = flags;
      *(sqlite3 **)(piVar2 + -2) = db;
      *piVar2 = 0;
      uVar1 = uVar1 - 1;
      piVar2 = piVar2 + 0xe;
    } while (1 < uVar1);
  }
  return;
}

Assistant:

static void initMemArray(Mem *p, int N, sqlite3 *db, u16 flags){
  if( N>0 ){
    do{
      p->flags = flags;
      p->db = db;
      p->szMalloc = 0;
#ifdef SQLITE_DEBUG
      p->pScopyFrom = 0;
#endif
      p++;
    }while( (--N)>0 );
  }
}